

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O1

TypeID NULLCTypeInfo::MemberType(int member,int *type)

{
  uint *puVar1;
  char *__function;
  long lVar2;
  
  if (linker == 0) {
    __assert_fail("linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                  ,0x1c,"TypeID NULLCTypeInfo::MemberType(int, int *)");
  }
  if ((uint)*type < *(uint *)(linker + 0x20c)) {
    lVar2 = (ulong)(uint)*type * 0x50;
    puVar1 = (uint *)(*(long *)(linker + 0x200) + lVar2);
    if (*(int *)(*(long *)(linker + 0x200) + 0x10 + lVar2) == 4) {
      if ((uint)member < puVar1[6]) {
        if (*(int *)(linker + 0x21c) != 0) {
          return (TypeID)*(uint *)(*(long *)(linker + 0x210) + (ulong)(member + puVar1[9]) * 0xc);
        }
        __function = 
        "T &FastVector<ExternMemberInfo>::operator[](unsigned int) [T = ExternMemberInfo, zeroNewMemory = false, skipConstructor = false]"
        ;
        goto LAB_00122795;
      }
      if (*puVar1 < *(uint *)(linker + 0x29c)) {
        nullcThrowError("typeid::memberType: member number illegal, type (%s) has only %d members",
                        (ulong)*puVar1 + *(long *)(linker + 0x290));
        return (TypeID)0;
      }
    }
    else if (*puVar1 < *(uint *)(linker + 0x29c)) {
      nullcThrowError("typeid::memberType: type (%s) is not a class",
                      (ulong)*puVar1 + *(long *)(linker + 0x290));
      return (TypeID)0;
    }
    __function = 
    "T &FastVector<char>::operator[](unsigned int) [T = char, zeroNewMemory = false, skipConstructor = false]"
    ;
  }
  else {
    __function = 
    "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
    ;
  }
LAB_00122795:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/../Array.h"
                ,0x7f,__function);
}

Assistant:

TypeID MemberType(int member, int* type)
	{
		assert(linker);
		ExternTypeInfo &exType = linker->exTypes[*type];
		if(exType.subCat != ExternTypeInfo::CAT_CLASS)
		{
			nullcThrowError("typeid::memberType: type (%s) is not a class", &linker->exSymbols[exType.offsetToName]);
			return getTypeID(0);
		}
		if((unsigned int)member >= exType.memberCount)
		{
			nullcThrowError("typeid::memberType: member number illegal, type (%s) has only %d members", &linker->exSymbols[exType.offsetToName], exType.memberCount);
			return getTypeID(0);
		}
		ExternMemberInfo *memberList = &linker->exTypeExtra[0];
		return getTypeID(memberList[exType.memberOffset + member].type);
	}